

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_dpb.c
# Opt level: O2

MPP_RET init_dpb(H264dVideoCtx_t *p_Vid,H264_DpbBuf_t *p_Dpb,RK_S32 type)

{
  h264_sps_t *phVar1;
  h264_frame_store_t *phVar2;
  uint uVar3;
  h264_frame_store_t **pphVar4;
  H264_FrameStore_t *pHVar5;
  H264_StorePic_t *pHVar6;
  byte bVar7;
  int iVar8;
  MPP_RET MVar9;
  int iVar10;
  undefined8 uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  RK_U32 RVar15;
  ulong uVar16;
  
  phVar1 = p_Vid->active_sps;
  if (phVar1 == (h264_sps_t *)0x0) {
    return MPP_NOK;
  }
  p_Dpb->p_Vid = p_Vid;
  if (p_Dpb->init_done != 0) {
    free_dpb(p_Dpb);
  }
  uVar12 = ((phVar1->pic_height_in_map_units_minus1 + 1) * (phVar1->pic_width_in_mbs_minus1 + 1) <<
           (phVar1->frame_mbs_only_flag == 0)) * 0x180;
  uVar13 = 0x25200;
  switch(phVar1->level_idc) {
  case 9:
  case 10:
    break;
  case 0xb:
    RVar15 = is_prext_profile(phVar1->profile_idc);
    if ((RVar15 != 0) || (phVar1->constrained_set3_flag != 1)) {
      uVar13 = 0x54600;
    }
    break;
  case 0xc:
  case 0xd:
  case 0x14:
    uVar13 = 0xdec00;
    break;
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
switchD_0018fd6a_caseD_e:
    uVar13 = 0;
    break;
  case 0x15:
    uVar13 = 0x1bd800;
    break;
  case 0x16:
  case 0x1e:
    uVar13 = 0x2f7600;
    break;
  case 0x1f:
    uVar13 = 0x697800;
    break;
  case 0x20:
    uVar13 = 0x780000;
    break;
  default:
    switch(phVar1->level_idc) {
    case 0x28:
    case 0x29:
      uVar13 = 0xc00000;
      break;
    case 0x2a:
      uVar13 = 0xcc0000;
      break;
    default:
      goto switchD_0018fd6a_caseD_e;
    case 0x32:
      uVar13 = 0x286e000;
      break;
    case 0x33:
    case 0x34:
      uVar13 = 0x4380000;
    }
  }
  uVar14 = (uint)((long)(ulong)uVar13 / (long)(int)uVar12);
  uVar13 = 0x10;
  if ((p_Vid->active_mvc_sps_flag == 0) ||
     ((p_Vid->profile_idc != 0x80 && (p_Vid->profile_idc != 0x76)))) {
    if (0xf < (int)uVar14) {
      uVar14 = uVar13;
    }
  }
  else {
    iVar10 = p_Vid->active_subsps->num_views_minus1 + 1;
    uVar3 = 0;
    iVar8 = 0;
    do {
      bVar7 = (byte)iVar8;
      iVar8 = iVar8 + 1;
      uVar3 = uVar3 + 8;
    } while (2 << (bVar7 & 0x1f) <= iVar10 * iVar10);
    uVar3 = uVar3 & 0x7ffffff0;
    if (iVar8 == 1) {
      uVar3 = uVar13;
    }
    if ((int)(uVar14 * 2) < (int)uVar3) {
      uVar3 = uVar14 * 2;
    }
    uVar14 = (int)uVar3 / iVar10;
  }
  uVar3 = uVar14;
  if ((phVar1->vui_parameters_present_flag != 0) &&
     ((phVar1->vui_seq_parameters).bitstream_restriction_flag != 0)) {
    RVar15 = (phVar1->vui_seq_parameters).max_dec_frame_buffering;
    if (((int)uVar14 < (int)RVar15) && (((byte)h264d_debug & 4) != 0)) {
      _mpp_log_l(4,"h264d_dpb","warnnig: max_dec_frame_buffering larger than MaxDpbSize",(char *)0x0
                );
      RVar15 = (phVar1->vui_seq_parameters).max_dec_frame_buffering;
    }
    uVar3 = RVar15 + (RVar15 == 0);
    if (((int)uVar3 < (int)uVar14) && (((byte)h264d_debug & 4) != 0)) {
      _mpp_log_l(4,"h264d_dpb",
                 "warning: max_dec_frame_buffering(%d) is less than dpb_size(%d) calculated from Profile/Level.\n"
                 ,(char *)0x0,(ulong)uVar3,(ulong)uVar14);
    }
  }
  uVar14 = phVar1->max_num_ref_frames;
  if ((int)uVar3 < (int)uVar14) {
    if (((byte)h264d_debug & 4) != 0) {
      _mpp_log_l(4,"h264d_dpb",
                 "warnning: DPB size is less than max_num_ref_frames, level(%d), pic_size(%d), max_num_ref_frames(%d).\n"
                 ,(char *)0x0,(ulong)(uint)phVar1->level_idc,(ulong)uVar12,uVar14);
      uVar14 = phVar1->max_num_ref_frames;
    }
    uVar3 = uVar13;
    if ((int)uVar14 < 0x10) {
      uVar3 = uVar14;
    }
  }
  RVar15 = uVar3 + (uVar3 == 0);
  p_Dpb->size = RVar15;
  p_Dpb->allocated_size = RVar15;
  p_Dpb->num_ref_frames = uVar14;
  if ((phVar1->max_dec_frame_buffering < (int)uVar14) && (((byte)h264d_debug & 4) != 0)) {
    _mpp_log_l(4,"h264d_dpb","DPB size at specified level is smaller than reference frames",
               (char *)0x0);
    RVar15 = p_Dpb->size;
  }
  p_Dpb->used_size = 0;
  p_Dpb->last_picture = (h264_frame_store_t *)0x0;
  p_Dpb->ref_frames_in_buffer = 0;
  p_Dpb->ltref_frames_in_buffer = 0;
  pphVar4 = (h264_frame_store_t **)mpp_osal_calloc("init_dpb",(ulong)RVar15 << 3);
  p_Dpb->fs = pphVar4;
  pphVar4 = (h264_frame_store_t **)mpp_osal_calloc("init_dpb",(ulong)p_Dpb->size << 3);
  p_Dpb->fs_ref = pphVar4;
  pphVar4 = (h264_frame_store_t **)mpp_osal_calloc("init_dpb",(ulong)p_Dpb->size << 3);
  p_Dpb->fs_ltref = pphVar4;
  pphVar4 = (h264_frame_store_t **)mpp_osal_calloc("init_dpb",8);
  p_Dpb->fs_ilref = pphVar4;
  if (((p_Dpb->fs == (h264_frame_store_t **)0x0) || (p_Dpb->fs_ref == (h264_frame_store_t **)0x0))
     || (pphVar4 == (h264_frame_store_t **)0x0 || p_Dpb->fs_ltref == (h264_frame_store_t **)0x0)) {
    if (((byte)h264d_debug & 1) == 0) {
      return MPP_ERR_MALLOC;
    }
    uVar11 = 0x7c3;
LAB_00190047:
    MVar9 = MPP_ERR_MALLOC;
    _mpp_log_l(4,"h264d_dpb","malloc buffer error(%d).\n",(char *)0x0,uVar11);
  }
  else {
    for (uVar16 = 0; uVar16 < p_Dpb->size; uVar16 = uVar16 + 1) {
      pHVar5 = alloc_frame_store();
      p_Dpb->fs[uVar16] = pHVar5;
      if (p_Dpb->fs[uVar16] == (h264_frame_store_t *)0x0) {
        if (((byte)h264d_debug & 1) == 0) {
          return MPP_ERR_MALLOC;
        }
        uVar11 = 0x7c6;
        goto LAB_00190047;
      }
      p_Dpb->fs_ref[uVar16] = (h264_frame_store_t *)0x0;
      p_Dpb->fs_ltref[uVar16] = (h264_frame_store_t *)0x0;
      phVar2 = p_Dpb->fs[uVar16];
      phVar2->layer_id = -1;
      phVar2->view_id = -1;
      phVar2->inter_view_flag[0] = 0;
      phVar2->inter_view_flag[1] = 0;
      phVar2->anchor_pic_flag[0] = 0;
      phVar2->anchor_pic_flag[1] = 0;
    }
    if (type == 2) {
      pHVar5 = alloc_frame_store();
      *p_Dpb->fs_ilref = pHVar5;
      phVar2 = *p_Dpb->fs_ilref;
      if (phVar2 == (h264_frame_store_t *)0x0) {
        if (((byte)h264d_debug & 1) == 0) {
          return MPP_ERR_MALLOC;
        }
        uVar11 = 2000;
        goto LAB_00190047;
      }
      phVar2->view_id = -1;
      phVar2->inter_view_flag[0] = 0;
      phVar2->inter_view_flag[1] = 0;
      phVar2->anchor_pic_flag[0] = 0;
      phVar2->anchor_pic_flag[1] = 0;
    }
    else {
      *p_Dpb->fs_ilref = (h264_frame_store_t *)0x0;
    }
    if (p_Vid->no_ref_pic == (h264_store_pic_t *)0x0) {
      pHVar6 = alloc_storable_picture(p_Vid,3);
      p_Vid->no_ref_pic = pHVar6;
      if (pHVar6 == (H264_StorePic_t *)0x0) {
        if (((byte)h264d_debug & 1) == 0) {
          return MPP_ERR_MALLOC;
        }
        uVar11 = 0x7dc;
        goto LAB_00190047;
      }
      pHVar6->top_field = pHVar6;
      pHVar6->bottom_field = pHVar6;
      pHVar6->frame = pHVar6;
    }
    p_Dpb->last_output_poc = -0x80000000;
    p_Dpb->last_output_view_id = -1;
    p_Vid->last_has_mmco_5 = 0;
    p_Dpb->init_done = 1;
    MVar9 = MPP_OK;
  }
  return MVar9;
}

Assistant:

MPP_RET init_dpb(H264dVideoCtx_t *p_Vid, H264_DpbBuf_t *p_Dpb, RK_S32 type)  // type=1 AVC type=2 MVC
{
    RK_U32 i = 0;
    MPP_RET ret = MPP_ERR_UNKNOW;
    H264_SPS_t *active_sps = p_Vid->active_sps;
    RK_U32 dpb_size;

    if (!active_sps) {
        ret = MPP_NOK;
        goto __FAILED;
    }
    p_Dpb->p_Vid = p_Vid;
    if (p_Dpb->init_done) {
        free_dpb(p_Dpb);
    }
    dpb_size = getDpbSize(p_Vid, active_sps);
    p_Dpb->size = MPP_MAX(1, dpb_size);
    p_Dpb->allocated_size = p_Dpb->size;
    p_Dpb->num_ref_frames = active_sps->max_num_ref_frames;
    if (active_sps->max_dec_frame_buffering < active_sps->max_num_ref_frames) {
        H264D_WARNNING("DPB size at specified level is smaller than reference frames");
    }
    p_Dpb->used_size = 0;
    p_Dpb->last_picture = NULL;
    p_Dpb->ref_frames_in_buffer = 0;
    p_Dpb->ltref_frames_in_buffer = 0;
    //--------
    p_Dpb->fs       = mpp_calloc(H264_FrameStore_t*, p_Dpb->size);
    p_Dpb->fs_ref   = mpp_calloc(H264_FrameStore_t*, p_Dpb->size);
    p_Dpb->fs_ltref = mpp_calloc(H264_FrameStore_t*, p_Dpb->size);
    p_Dpb->fs_ilref = mpp_calloc(H264_FrameStore_t*, 1);  //!< inter-layer reference (for multi-layered codecs)
    MEM_CHECK(ret, p_Dpb->fs && p_Dpb->fs_ref && p_Dpb->fs_ltref && p_Dpb->fs_ilref);
    for (i = 0; i < p_Dpb->size; i++) {
        p_Dpb->fs[i] = alloc_frame_store();
        MEM_CHECK(ret, p_Dpb->fs[i]);
        p_Dpb->fs_ref[i] = NULL;
        p_Dpb->fs_ltref[i] = NULL;
        p_Dpb->fs[i]->layer_id = -1;
        p_Dpb->fs[i]->view_id = -1;
        p_Dpb->fs[i]->inter_view_flag[0] = p_Dpb->fs[i]->inter_view_flag[1] = 0;
        p_Dpb->fs[i]->anchor_pic_flag[0] = p_Dpb->fs[i]->anchor_pic_flag[1] = 0;
    }
    if (type == 2) {
        p_Dpb->fs_ilref[0] = alloc_frame_store();
        MEM_CHECK(ret, p_Dpb->fs_ilref[0]);
        //!< These may need some cleanups
        p_Dpb->fs_ilref[0]->view_id = -1;
        p_Dpb->fs_ilref[0]->inter_view_flag[0] = p_Dpb->fs_ilref[0]->inter_view_flag[1] = 0;
        p_Dpb->fs_ilref[0]->anchor_pic_flag[0] = p_Dpb->fs_ilref[0]->anchor_pic_flag[1] = 0;
        //!< given that this is in a different buffer, do we even need proc_flag anymore?
    } else {
        p_Dpb->fs_ilref[0] = NULL;
    }
    //!< allocate a dummy storable picture
    if (!p_Vid->no_ref_pic) {
        p_Vid->no_ref_pic = alloc_storable_picture(p_Vid, FRAME);
        MEM_CHECK(ret, p_Vid->no_ref_pic);
        p_Vid->no_ref_pic->top_field = p_Vid->no_ref_pic;
        p_Vid->no_ref_pic->bottom_field = p_Vid->no_ref_pic;
        p_Vid->no_ref_pic->frame = p_Vid->no_ref_pic;
    }
    p_Dpb->last_output_poc = INT_MIN;
    p_Dpb->last_output_view_id = -1;
    p_Vid->last_has_mmco_5 = 0;
    p_Dpb->init_done = 1;

    return ret = MPP_OK;
__FAILED:
    return ret;
}